

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O0

int __thiscall squall::Coroutine::yielded<int>(Coroutine *this)

{
  wrapper_type wVar1;
  Coroutine *this_local;
  
  validate_vm(this);
  wVar1 = detail::fetch<int,(squall::detail::FetchContext)4>(this->vm_,-1);
  return wVar1;
}

Assistant:

R yielded() {
        validate_vm();
        return detail::fetch<R, detail::FetchContext::YieldedValue>(vm_, -1);
    }